

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

idx_t __thiscall duckdb::FSSTCompressionState::Finalize(FSSTCompressionState *this)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  uint32_t *puVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  pointer puVar4;
  BlockManager *pBVar5;
  StringDictionaryContainer SVar6;
  undefined1 auVar7 [16];
  data_ptr_t pdVar8;
  FSSTCompressionState *pFVar9;
  uint uVar10;
  pointer pCVar11;
  BufferManager *pBVar12;
  unsigned_long uVar13;
  idx_t iVar14;
  idx_t iVar15;
  type pCVar16;
  InternalException *this_01;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  pointer in;
  ulong uVar20;
  BufferHandle handle;
  BufferHandle local_f8;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *local_e0;
  data_ptr_t local_d8;
  FSSTCompressionState *local_d0;
  ulong local_c8;
  ulong local_c0;
  string local_b8 [4];
  
  this_00 = &this->current_segment;
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  pBVar12 = BufferManager::GetBufferManager(pCVar11->db);
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  (*pBVar12->_vptr_BufferManager[7])(&local_f8,pBVar12,&pCVar11->block);
  pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
            operator->(this_00);
  uVar17 = (pCVar11->super_SegmentBase<duckdb::ColumnSegment>).count.
           super___atomic_base<unsigned_long>._M_i;
  bVar2 = this->current_width;
  if ((uVar17 & 0x1f) != 0) {
    uVar13 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar17 & 0x1f);
    uVar17 = (uVar17 - uVar13) + 0x20;
  }
  local_c0 = bVar2 * uVar17 >> 3;
  uVar17 = local_c0 +
           (ulong)(this->current_dictionary).size + this->fsst_serialized_symbol_table_size + 0x10;
  if (uVar17 == this->last_fitting_size) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f8.node);
    pdVar3 = (local_f8.node.ptr)->buffer;
    puVar4 = (this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_e0 = this_00;
    pCVar11 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
              operator->(this_00);
    local_c8 = (pCVar11->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i;
    bVar2 = this->current_width;
    uVar20 = local_c8 & 0xffffffffffffffe0;
    local_d8 = pdVar3;
    local_d0 = this;
    if (uVar20 != 0) {
      uVar18 = 0;
      uVar19 = 0;
      in = puVar4;
      do {
        duckdb_fastpforlib::fastpack(in,(uint32_t *)(pdVar3 + (uVar18 >> 3) + 0x10),(uint)bVar2);
        uVar19 = uVar19 + 0x20;
        in = in + 0x20;
        uVar18 = uVar18 + (ulong)bVar2 * 0x20;
      } while (uVar19 < uVar20);
    }
    if ((local_c8 & 0x1f) != 0) {
      uVar18 = (ulong)(((uint)local_c8 & 0x1f) << 2);
      switchD_01306cb1::default
                ((void *)((long)&local_b8[0]._M_dataplus._M_p + uVar18),0,0x80 - uVar18);
      switchD_012dd528::default(local_b8,puVar4 + uVar20,uVar18);
      duckdb_fastpforlib::fastpack
                ((uint32_t *)local_b8,(uint32_t *)(pdVar3 + (bVar2 * uVar20 >> 3) + 0x10),
                 (uint)bVar2);
    }
    pFVar9 = local_d0;
    pdVar8 = local_d8;
    uVar13 = local_c0 + 0x10;
    pdVar3 = local_d8 + uVar13;
    if (local_d0->fsst_encoder == (duckdb_fsst_encoder_t *)0x0) {
      switchD_01306cb1::default(pdVar3,0,local_d0->fsst_serialized_symbol_table_size);
    }
    else {
      switchD_012dd528::default
                (pdVar3,local_d0->fsst_serialized_symbol_table,
                 local_d0->fsst_serialized_symbol_table_size);
    }
    uVar10 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar13);
    *(uint *)(pdVar8 + 0xc) = uVar10;
    *(uint *)(pdVar8 + 8) = (uint)pFVar9->current_width;
    pBVar5 = (pFVar9->super_CompressionState).info.block_manager;
    iVar14 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
    iVar15 = optional_idx::GetIndex(&pBVar5->block_header_size);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = iVar14 - iVar15;
    pBVar5 = (pFVar9->super_CompressionState).info.block_manager;
    if (uVar17 < (SUB168(auVar7 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc)) {
      iVar14 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
      iVar15 = optional_idx::GetIndex(&pBVar5->block_header_size);
      uVar20 = (ulong)(pFVar9->current_dictionary).size;
      memmove(pdVar3 + pFVar9->fsst_serialized_symbol_table_size,
              pdVar8 + ((pFVar9->current_dictionary).end - uVar20),uVar20);
      puVar1 = &(pFVar9->current_dictionary).end;
      *puVar1 = *puVar1 + (int)iVar15 + ((int)uVar17 - (int)iVar14);
      pCVar16 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                ::operator*(local_e0);
      SVar6 = pFVar9->current_dictionary;
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_f8.node);
      *(StringDictionaryContainer *)((local_f8.node.ptr)->buffer + pCVar16->offset) = SVar6;
    }
    else {
      iVar14 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
      iVar15 = optional_idx::GetIndex(&pBVar5->block_header_size);
      uVar17 = iVar14 - iVar15;
    }
    BufferHandle::~BufferHandle(&local_f8);
    return uVar17;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_b8[0]._M_dataplus._M_p = (pointer)&local_b8[0].field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"FSST string compression failed due to incorrect size calculation",
             "");
  InternalException::InternalException(this_01,local_b8);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t Finalize() {
		auto &buffer_manager = BufferManager::GetBufferManager(current_segment->db);
		auto handle = buffer_manager.Pin(current_segment->block);
		D_ASSERT(current_dictionary.end == info.GetBlockSize());

		// calculate sizes
		auto compressed_index_buffer_size =
		    BitpackingPrimitives::GetRequiredSize(current_segment->count, current_width);
		auto total_size = sizeof(fsst_compression_header_t) + compressed_index_buffer_size + current_dictionary.size +
		                  fsst_serialized_symbol_table_size;

		if (total_size != last_fitting_size) {
			throw InternalException("FSST string compression failed due to incorrect size calculation");
		}

		// calculate ptr and offsets
		auto base_ptr = handle.Ptr();
		auto header_ptr = reinterpret_cast<fsst_compression_header_t *>(base_ptr);
		auto compressed_index_buffer_offset = sizeof(fsst_compression_header_t);
		auto symbol_table_offset = compressed_index_buffer_offset + compressed_index_buffer_size;

		D_ASSERT(current_segment->count == index_buffer.size());
		BitpackingPrimitives::PackBuffer<sel_t, false>(base_ptr + compressed_index_buffer_offset,
		                                               reinterpret_cast<uint32_t *>(index_buffer.data()),
		                                               current_segment->count, current_width);

		// Write the fsst symbol table or nothing
		if (fsst_encoder != nullptr) {
			memcpy(base_ptr + symbol_table_offset, &fsst_serialized_symbol_table[0], fsst_serialized_symbol_table_size);
		} else {
			memset(base_ptr + symbol_table_offset, 0, fsst_serialized_symbol_table_size);
		}

		Store<uint32_t>(NumericCast<uint32_t>(symbol_table_offset),
		                data_ptr_cast(&header_ptr->fsst_symbol_table_offset));
		Store<uint32_t>((uint32_t)current_width, data_ptr_cast(&header_ptr->bitpacking_width));

		if (total_size >= info.GetCompactionFlushLimit()) {
			// the block is full enough, don't bother moving around the dictionary
			return info.GetBlockSize();
		}

		// the block has space left: figure out how much space we can save
		auto move_amount = info.GetBlockSize() - total_size;
		// move the dictionary so it lines up exactly with the offsets
		auto new_dictionary_offset = symbol_table_offset + fsst_serialized_symbol_table_size;
		memmove(base_ptr + new_dictionary_offset, base_ptr + current_dictionary.end - current_dictionary.size,
		        current_dictionary.size);
		current_dictionary.end -= move_amount;
		D_ASSERT(current_dictionary.end == total_size);
		// write the new dictionary (with the updated "end")
		FSSTStorage::SetDictionary(*current_segment, handle, current_dictionary);

		return total_size;
	}